

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

void __thiscall OpenMD::FragmentStamp::checkRigidBodies(FragmentStamp *this)

{
  pointer ppRVar1;
  __normal_iterator<OpenMD::RigidBodyStamp_**,_std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>_>
  _Var2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  ostream *poVar4;
  OpenMDException *pOVar5;
  ulong uVar6;
  long lVar7;
  string local_1f0;
  vector<int,_std::allocator<int>_> rigidAtoms;
  _Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> local_1b8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  local_1f0._M_dataplus._M_p = (pointer)0x0;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::RigidBodyStamp**,std::vector<OpenMD::RigidBodyStamp*,std::allocator<OpenMD::RigidBodyStamp*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::RigidBodyStamp*const>>
                    ((this->rigidBodyStamps_).
                     super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->rigidBodyStamps_).
                     super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var2._M_current !=
      (this->rigidBodyStamps_).
      super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    poVar4 = std::operator<<((ostream *)&oss,"Error in Fragment ");
    std::__cxx11::string::string((string *)&local_1f0,(string *)&(this->Name).data_);
    poVar4 = std::operator<<(poVar4,(string *)&local_1f0);
    poVar4 = std::operator<<(poVar4,":rigidBody[");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::operator<<(poVar4,"] is missing\n");
    std::__cxx11::string::~string((string *)&local_1f0);
    pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    OpenMDException::OpenMDException(pOVar5,&local_1f0);
    __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  lVar7 = 0;
  uVar6 = 0;
  while( true ) {
    ppRVar1 = (this->rigidBodyStamps_).
              super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)_Var2._M_current - (long)ppRVar1 >> 3) <= uVar6) {
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
      return;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &rigidAtoms.super__Vector_base<int,_std::allocator<int>_>,
               (vector<int,_std::allocator<int>_> *)
               (*(long *)((long)ppRVar1 + (lVar7 >> 0x1d)) + 0x70));
    local_1b8._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>)
         (((long)(this->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
    _Var3 = std::
            find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       rigidAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       rigidAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_1b8);
    if (_Var3._M_current !=
        rigidAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) break;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&rigidAtoms.super__Vector_base<int,_std::allocator<int>_>);
    uVar6 = uVar6 + 1;
    _Var2._M_current =
         (this->rigidBodyStamps_).
         super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    lVar7 = lVar7 + 0x100000000;
  }
  poVar4 = std::operator<<((ostream *)&oss,"Error in Fragment ");
  std::__cxx11::string::string((string *)&local_1f0,(string *)&(this->Name).data_);
  std::operator<<(poVar4,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(pOVar5,&local_1f0);
  __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void FragmentStamp::checkRigidBodies() {
    std::ostringstream oss;
    std::vector<RigidBodyStamp*>::iterator ri =
        std::find(rigidBodyStamps_.begin(), rigidBodyStamps_.end(),
                  static_cast<RigidBodyStamp*>(NULL));
    if (ri != rigidBodyStamps_.end()) {
      oss << "Error in Fragment " << getName() << ":rigidBody["
          << ri - rigidBodyStamps_.begin() << "] is missing\n";
      throw OpenMDException(oss.str());
    }

    for (std::size_t i = 0; i < getNRigidBodies(); ++i) {
      RigidBodyStamp* rbStamp      = getRigidBodyStamp(i);
      std::vector<int> rigidAtoms  = rbStamp->getMembers();
      std::vector<int>::iterator j = std::find_if(
          rigidAtoms.begin(), rigidAtoms.end(),
          std::bind(std::greater<int>(), placeholders::_1, getNAtoms() - 1));
      if (j != rigidAtoms.end()) {
        oss << "Error in Fragment " << getName();
        throw OpenMDException(oss.str());
      }
    }
  }